

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cencode.c
# Opt level: O1

size_t rcnb_encode_block(char *plaintext_in,size_t length_in,wchar_t *code_out,
                        rcnb_encodestate *state_in)

{
  ulong uVar1;
  wchar_t *code_char;
  wchar_t *local_40;
  wchar_t *local_38;
  
  if (length_in != 0) {
    local_40 = code_out;
    local_38 = code_out;
    if (state_in->cached == true) {
      rcnb_encode_short(CONCAT11(state_in->trailing_byte,*plaintext_in),&local_40);
      plaintext_in = plaintext_in + 1;
      length_in = length_in - 1;
      state_in->cached = false;
    }
    if (1 < length_in) {
      uVar1 = 0;
      do {
        rcnb_encode_short(*(ushort *)(plaintext_in + uVar1 * 2) << 8 |
                          *(ushort *)(plaintext_in + uVar1 * 2) >> 8,&local_40);
        uVar1 = uVar1 + 1;
      } while (length_in >> 1 != uVar1);
    }
    if ((length_in & 1) != 0) {
      state_in->trailing_byte = plaintext_in[length_in - 1];
      state_in->cached = true;
    }
    *local_40 = L'\0';
    return (long)local_40 - (long)local_38 >> 2;
  }
  return 0;
}

Assistant:

size_t rcnb_encode_block(const char* plaintext_in, size_t length_in,
        wchar_t* const code_out, rcnb_encodestate* state_in)
{
    if (length_in == 0)
        return 0;
    wchar_t* code_char = code_out;
    if (state_in->cached) {
        rcnb_encode_short(*(unsigned char*)(&state_in->trailing_byte) << 8 | *(unsigned char*)(&plaintext_in[0]),
                &code_char);
        plaintext_in++;
        length_in--;
        state_in->cached = false;
    }
#if defined(ENABLE_AVX2) || defined(ENABLE_SSSE3) || defined(ENABLE_NEON)
    size_t batch = length_in >> 5;
    if (batch > 0) {
        rcnb_encode_32n_asm(plaintext_in, (char *) code_char, batch);
    }
    plaintext_in += 32 * batch;
    code_char += 64 * batch;
    length_in = length_in & 31;
#endif
    for (int i = 0; i < (length_in >> 1); ++i)
        rcnb_encode_short(*(unsigned char*)(&plaintext_in[i * 2]) << 8 | *(unsigned char*)(&plaintext_in[i * 2 + 1]),
                &code_char);
    if (length_in & 1) {
        state_in->trailing_byte = plaintext_in[length_in - 1];
        state_in->cached = true;
    }
    *code_char = 0;
    return code_char - code_out;
}